

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkExtract(char *pFileName0,char *pFileName1,int fVerbose,Gia_Man_t **ppGiaF,
                  Gia_Man_t **ppGiaG,Vec_Int_t **pvNodes,Vec_Ptr_t **pvNodesR)

{
  Acb_Ntk_t *p;
  Acb_Ntk_t *p_00;
  Gia_Man_t *pGia;
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  
  iVar3 = 0;
  p = Acb_VerilogSimpleRead(pFileName0,(char *)0x0);
  p_00 = Acb_VerilogSimpleRead(pFileName1,(char *)0x0);
  if (p_00 == (Acb_Ntk_t *)0x0 || p == (Acb_Ntk_t *)0x0) {
    if (p == (Acb_Ntk_t *)0x0) goto LAB_003887fd;
  }
  else {
    pGia = Acb_NtkToGia2(p);
    pGVar1 = Acb_NtkToGia2(p_00);
    if ((p->vCis).nSize != (p_00->vCis).nSize) {
      __assert_fail("Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x288,
                    "int Acb_NtkExtract(char *, char *, int, Gia_Man_t **, Gia_Man_t **, Vec_Int_t **, Vec_Ptr_t **)"
                   );
    }
    if ((p->vCos).nSize != (p_00->vCos).nSize) {
      __assert_fail("Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x289,
                    "int Acb_NtkExtract(char *, char *, int, Gia_Man_t **, Gia_Man_t **, Vec_Int_t **, Vec_Ptr_t **)"
                   );
    }
    *ppGiaF = pGia;
    *ppGiaG = pGVar1;
    pVVar2 = Acb_NtkCollectCopies(p,pGia,pvNodesR);
    *pvNodes = pVVar2;
    iVar3 = 1;
  }
  Acb_ManFree(p->pDesign);
LAB_003887fd:
  if (p_00 != (Acb_Ntk_t *)0x0) {
    Acb_ManFree(p_00->pDesign);
  }
  return iVar3;
}

Assistant:

int Acb_NtkExtract( char * pFileName0, char * pFileName1, int fVerbose, 
                    Gia_Man_t ** ppGiaF, Gia_Man_t ** ppGiaG, Vec_Int_t ** pvNodes, Vec_Ptr_t ** pvNodesR )
{
    extern Acb_Ntk_t * Acb_VerilogSimpleRead( char * pFileName, char * pFileNameW );
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileName0, NULL );
    Acb_Ntk_t * pNtkG = Acb_VerilogSimpleRead( pFileName1, NULL );
    int RetValue = 0;
    if ( pNtkF && pNtkG )
    {
        Gia_Man_t * pGiaF = Acb_NtkToGia2( pNtkF );
        Gia_Man_t * pGiaG = Acb_NtkToGia2( pNtkG );
        assert( Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG) );
        assert( Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG) );
        *ppGiaF  = pGiaF;
        *ppGiaG  = pGiaG;
        *pvNodes = Acb_NtkCollectCopies( pNtkF, pGiaF, pvNodesR );
        RetValue = 1;
    }
    if ( pNtkF ) Acb_ManFree( pNtkF->pDesign );
    if ( pNtkG ) Acb_ManFree( pNtkG->pDesign );
    return RetValue;
}